

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O0

void __thiscall
slang::syntax::CoverpointSyntax::CoverpointSyntax
          (CoverpointSyntax *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes,
          DataTypeSyntax *type,NamedLabelSyntax *label,Token coverpoint,ExpressionSyntax *expr,
          CoverageIffClauseSyntax *iff,Token openBrace,
          SyntaxList<slang::syntax::MemberSyntax> *members,Token closeBrace,Token emptySemi)

{
  Token TVar1;
  Token TVar2;
  Token TVar3;
  DataTypeSyntax *pDVar4;
  ExpressionSyntax *pEVar5;
  iterator ppMVar6;
  MemberSyntax *child;
  iterator __end2;
  iterator __begin2;
  SyntaxList<slang::syntax::MemberSyntax> *__range2;
  NamedLabelSyntax *local_40;
  NamedLabelSyntax *local_38;
  NamedLabelSyntax *label_local;
  DataTypeSyntax *type_local;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes_local;
  CoverpointSyntax *this_local;
  Token coverpoint_local;
  
  TVar3 = emptySemi;
  TVar2 = closeBrace;
  TVar1 = openBrace;
  coverpoint_local._0_8_ = coverpoint.info;
  this_local = coverpoint._0_8_;
  local_38 = label;
  label_local = (NamedLabelSyntax *)type;
  type_local = (DataTypeSyntax *)attributes;
  attributes_local = (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)this;
  MemberSyntax::MemberSyntax(&this->super_MemberSyntax,Coverpoint,attributes);
  local_40 = label_local;
  not_null<slang::syntax::DataTypeSyntax*>::not_null<slang::syntax::DataTypeSyntax*,void>
            ((not_null<slang::syntax::DataTypeSyntax*> *)&this->type,(DataTypeSyntax **)&local_40);
  this->label = local_38;
  *(CoverpointSyntax **)&this->coverpoint = this_local;
  (this->coverpoint).info = (Info *)coverpoint_local._0_8_;
  __range2 = (SyntaxList<slang::syntax::MemberSyntax> *)expr;
  not_null<slang::syntax::ExpressionSyntax*>::not_null<slang::syntax::ExpressionSyntax*,void>
            ((not_null<slang::syntax::ExpressionSyntax*> *)&this->expr,
             (ExpressionSyntax **)&__range2);
  this->iff = iff;
  (this->openBrace).kind = openBrace.kind;
  (this->openBrace).field_0x2 = openBrace._2_1_;
  (this->openBrace).numFlags = (NumericTokenFlags)openBrace.numFlags.raw;
  (this->openBrace).rawLen = openBrace.rawLen;
  openBrace.info = TVar1.info;
  (this->openBrace).info = openBrace.info;
  SyntaxList<slang::syntax::MemberSyntax>::SyntaxList(&this->members,members);
  (this->closeBrace).kind = closeBrace.kind;
  (this->closeBrace).field_0x2 = closeBrace._2_1_;
  (this->closeBrace).numFlags = (NumericTokenFlags)closeBrace.numFlags.raw;
  (this->closeBrace).rawLen = closeBrace.rawLen;
  closeBrace.info = TVar2.info;
  (this->closeBrace).info = closeBrace.info;
  (this->emptySemi).kind = emptySemi.kind;
  (this->emptySemi).field_0x2 = emptySemi._2_1_;
  (this->emptySemi).numFlags = (NumericTokenFlags)emptySemi.numFlags.raw;
  (this->emptySemi).rawLen = emptySemi.rawLen;
  emptySemi.info = TVar3.info;
  (this->emptySemi).info = emptySemi.info;
  pDVar4 = not_null<slang::syntax::DataTypeSyntax_*>::operator->(&this->type);
  (pDVar4->super_ExpressionSyntax).super_SyntaxNode.parent = (SyntaxNode *)this;
  if (this->label != (NamedLabelSyntax *)0x0) {
    (this->label->super_SyntaxNode).parent = (SyntaxNode *)this;
  }
  pEVar5 = not_null<slang::syntax::ExpressionSyntax_*>::operator->(&this->expr);
  (pEVar5->super_SyntaxNode).parent = (SyntaxNode *)this;
  if (this->iff != (CoverageIffClauseSyntax *)0x0) {
    (this->iff->super_SyntaxNode).parent = (SyntaxNode *)this;
  }
  (this->members).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)this;
  __end2 = nonstd::span_lite::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>::begin
                     (&(this->members).
                       super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>);
  ppMVar6 = nonstd::span_lite::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>::end
                      (&(this->members).
                        super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>);
  for (; __end2 != ppMVar6; __end2 = __end2 + 1) {
    ((*__end2)->super_SyntaxNode).parent = (SyntaxNode *)this;
  }
  return;
}

Assistant:

CoverpointSyntax(const SyntaxList<AttributeInstanceSyntax>& attributes, DataTypeSyntax& type, NamedLabelSyntax* label, Token coverpoint, ExpressionSyntax& expr, CoverageIffClauseSyntax* iff, Token openBrace, const SyntaxList<MemberSyntax>& members, Token closeBrace, Token emptySemi) :
        MemberSyntax(SyntaxKind::Coverpoint, attributes), type(&type), label(label), coverpoint(coverpoint), expr(&expr), iff(iff), openBrace(openBrace), members(members), closeBrace(closeBrace), emptySemi(emptySemi) {
        this->type->parent = this;
        if (this->label) this->label->parent = this;
        this->expr->parent = this;
        if (this->iff) this->iff->parent = this;
        this->members.parent = this;
        for (auto child : this->members)
            child->parent = this;
    }